

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentTrumpRule.h
# Opt level: O0

bool __thiscall DifferentTrumpRule::isTrump(DifferentTrumpRule *this,bool previous,Card *card)

{
  bool bVar1;
  vector<Card,_std::allocator<Card>_> local_38;
  Card *local_20;
  Card *card_local;
  DifferentTrumpRule *pDStack_10;
  bool previous_local;
  DifferentTrumpRule *this_local;
  
  local_20 = card;
  card_local._7_1_ = previous;
  pDStack_10 = this;
  std::vector<Card,_std::allocator<Card>_>::vector(&local_38,&this->m_trumpCards);
  bVar1 = contains<Card>(&local_38,*local_20);
  std::vector<Card,_std::allocator<Card>_>::~vector(&local_38);
  return bVar1;
}

Assistant:

virtual bool isTrump(bool previous, const Card &card){
        return contains(m_trumpCards, card);
    }